

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O0

AddrInfo * __thiscall
AddrManImpl::Create(AddrManImpl *this,CAddress *addr,CNetAddr *addrSource,nid_type *pnId)

{
  long lVar1;
  long lVar2;
  mapped_type *pmVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  long *in_RCX;
  CNetAddr *in_RDX;
  CAddress *in_RSI;
  AddrInfo *in_RDI;
  long in_FS_OFFSET;
  nid_type nId;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  AddrInfo *in_stack_ffffffffffffff00;
  AddrInfo *in_stack_ffffffffffffff08;
  AddrInfo *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            ((char *)in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00,
             in_stack_fffffffffffffefc,(AnnotatedMixin<std::mutex> *)0x87e2c2);
  lVar2 = *(long *)((long)&in_RDI[1].source.m_addr._union + 8);
  *(long *)((long)&in_RDI[1].source.m_addr._union + 8) = lVar2 + 1;
  AddrInfo::AddrInfo(this_00,in_RSI,in_RDX);
  std::
  unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
  ::operator[]((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
                *)in_stack_ffffffffffffff08,(key_type *)in_stack_ffffffffffffff00);
  AddrInfo::operator=(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  AddrInfo::~AddrInfo((AddrInfo *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  pmVar3 = std::
           unordered_map<CService,_long,_CServiceHash,_std::equal_to<CService>,_std::allocator<std::pair<const_CService,_long>_>_>
           ::operator[]((unordered_map<CService,_long,_CServiceHash,_std::equal_to<CService>,_std::allocator<std::pair<const_CService,_long>_>_>
                         *)in_stack_ffffffffffffff08,(key_type *)in_stack_ffffffffffffff00);
  *pmVar3 = lVar2;
  sVar4 = std::vector<long,_std::allocator<long>_>::size
                    ((vector<long,_std::allocator<long>_> *)
                     CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  pmVar5 = std::
           unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
           ::operator[]((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
                         *)in_stack_ffffffffffffff08,(key_type *)in_stack_ffffffffffffff00);
  pmVar5->nRandomPos = (int)sVar4;
  std::vector<long,_std::allocator<long>_>::push_back
            ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffff08,
             (value_type_conflict3 *)in_stack_ffffffffffffff00);
  *(int *)&in_RDI[0x402].fInTried = *(int *)&in_RDI[0x402].fInTried + 1;
  CNetAddr::GetNetwork((CNetAddr *)in_stack_ffffffffffffff00);
  pmVar6 = std::
           unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
           ::operator[]((unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
                         *)in_stack_ffffffffffffff08,(key_type *)in_stack_ffffffffffffff00);
  pmVar6->n_new = pmVar6->n_new + 1;
  if (in_RCX != (long *)0x0) {
    *in_RCX = lVar2;
  }
  pmVar5 = std::
           unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
           ::operator[]((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
                         *)in_stack_ffffffffffffff08,(key_type *)in_stack_ffffffffffffff00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pmVar5;
  }
  __stack_chk_fail();
}

Assistant:

AddrInfo* AddrManImpl::Create(const CAddress& addr, const CNetAddr& addrSource, nid_type* pnId)
{
    AssertLockHeld(cs);

    nid_type nId = nIdCount++;
    mapInfo[nId] = AddrInfo(addr, addrSource);
    mapAddr[addr] = nId;
    mapInfo[nId].nRandomPos = vRandom.size();
    vRandom.push_back(nId);
    nNew++;
    m_network_counts[addr.GetNetwork()].n_new++;
    if (pnId)
        *pnId = nId;
    return &mapInfo[nId];
}